

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(ColumnMetaData *a,ColumnMetaData *b)

{
  _ColumnMetaData__isset _Var1;
  type tVar2;
  type tVar3;
  int32_t iVar4;
  int64_t iVar5;
  
  tVar2 = a->type;
  a->type = b->type;
  b->type = tVar2;
  std::swap<duckdb::vector<duckdb_parquet::Encoding::type,true>>(&a->encodings,&b->encodings);
  std::swap<duckdb::vector<std::__cxx11::string,true>>(&a->path_in_schema,&b->path_in_schema);
  tVar3 = a->codec;
  a->codec = b->codec;
  b->codec = tVar3;
  iVar5 = a->num_values;
  a->num_values = b->num_values;
  b->num_values = iVar5;
  iVar5 = a->total_uncompressed_size;
  a->total_uncompressed_size = b->total_uncompressed_size;
  b->total_uncompressed_size = iVar5;
  iVar5 = a->total_compressed_size;
  a->total_compressed_size = b->total_compressed_size;
  b->total_compressed_size = iVar5;
  std::swap<duckdb::vector<duckdb_parquet::KeyValue,true>>
            (&a->key_value_metadata,&b->key_value_metadata);
  iVar5 = a->data_page_offset;
  a->data_page_offset = b->data_page_offset;
  b->data_page_offset = iVar5;
  iVar5 = a->index_page_offset;
  a->index_page_offset = b->index_page_offset;
  b->index_page_offset = iVar5;
  iVar5 = a->dictionary_page_offset;
  a->dictionary_page_offset = b->dictionary_page_offset;
  b->dictionary_page_offset = iVar5;
  swap(&a->statistics,&b->statistics);
  std::swap<duckdb::vector<duckdb_parquet::PageEncodingStats,true>>
            (&a->encoding_stats,&b->encoding_stats);
  iVar5 = a->bloom_filter_offset;
  a->bloom_filter_offset = b->bloom_filter_offset;
  b->bloom_filter_offset = iVar5;
  iVar4 = a->bloom_filter_length;
  a->bloom_filter_length = b->bloom_filter_length;
  b->bloom_filter_length = iVar4;
  swap(&a->size_statistics,&b->size_statistics);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(ColumnMetaData &a, ColumnMetaData &b) {
  using ::std::swap;
  swap(a.type, b.type);
  swap(a.encodings, b.encodings);
  swap(a.path_in_schema, b.path_in_schema);
  swap(a.codec, b.codec);
  swap(a.num_values, b.num_values);
  swap(a.total_uncompressed_size, b.total_uncompressed_size);
  swap(a.total_compressed_size, b.total_compressed_size);
  swap(a.key_value_metadata, b.key_value_metadata);
  swap(a.data_page_offset, b.data_page_offset);
  swap(a.index_page_offset, b.index_page_offset);
  swap(a.dictionary_page_offset, b.dictionary_page_offset);
  swap(a.statistics, b.statistics);
  swap(a.encoding_stats, b.encoding_stats);
  swap(a.bloom_filter_offset, b.bloom_filter_offset);
  swap(a.bloom_filter_length, b.bloom_filter_length);
  swap(a.size_statistics, b.size_statistics);
  swap(a.__isset, b.__isset);
}